

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *start,
          unsigned_long *end)

{
  bool bVar1;
  long lVar2;
  ulong *puVar3;
  string<unsigned_long> s;
  undefined1 local_30 [32];
  
  lVar2 = (long)end - (long)start >> 3;
  if (lVar2 < 3) {
    puVar3 = start;
    if (start != end) {
      do {
        if ((0x20 < *puVar3) || ((0x100002600U >> (*puVar3 & 0x3f) & 1) == 0)) goto LAB_006d8008;
        puVar3 = puVar3 + 1;
      } while (puVar3 != end);
    }
    bVar1 = false;
  }
  else {
LAB_006d8008:
    core::string<unsigned_long>::string<unsigned_long>
              ((string<unsigned_long> *)(local_30 + 0x10),start,(s32)lVar2);
    replaceSpecialCharacters
              ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)local_30,
               (string<unsigned_long> *)this);
    core::string<unsigned_long>::operator=(&this->NodeName,(string<unsigned_long> *)local_30);
    if ((_func_int **)local_30._0_8_ != (_func_int **)0x0) {
      operator_delete__((void *)local_30._0_8_);
    }
    this->CurrentNodeType = EXN_TEXT;
    if ((unsigned_long *)local_30._16_8_ != (unsigned_long *)0x0) {
      operator_delete__((void *)local_30._16_8_);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}